

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGen.c
# Opt level: O1

int Gia_ManSimulateWords(Gia_Man_t *p,int nWords)

{
  uint uVar1;
  Vec_Wrd_t *pVVar2;
  word *pwVar3;
  ulong uVar4;
  word wVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  
  if (p->vSims != (Vec_Wrd_t *)0x0) {
    pwVar3 = p->vSims->pArray;
    if (pwVar3 != (word *)0x0) {
      free(pwVar3);
      p->vSims->pArray = (word *)0x0;
    }
    if (p->vSims != (Vec_Wrd_t *)0x0) {
      free(p->vSims);
      p->vSims = (Vec_Wrd_t *)0x0;
    }
  }
  lVar12 = (long)nWords * (long)p->nObjs;
  pVVar2 = (Vec_Wrd_t *)malloc(0x10);
  iVar11 = (int)lVar12;
  iVar6 = 0x10;
  if (0xe < iVar11 - 1U) {
    iVar6 = iVar11;
  }
  pVVar2->nSize = 0;
  pVVar2->nCap = iVar6;
  if (iVar6 == 0) {
    pwVar3 = (word *)0x0;
  }
  else {
    pwVar3 = (word *)malloc((long)iVar6 << 3);
  }
  pVVar2->pArray = pwVar3;
  pVVar2->nSize = iVar11;
  memset(pwVar3,0,lVar12 * 8);
  p->vSims = pVVar2;
  p->nSimWords = nWords;
  if (1 < p->nObjs) {
    lVar12 = 1;
    do {
      uVar7 = (uint)*(ulong *)(p->pObjs + lVar12);
      uVar4 = *(ulong *)(p->pObjs + lVar12) & 0x1fffffff;
      iVar11 = (int)lVar12;
      if (uVar4 == 0x1fffffff || (int)uVar7 < 0) {
        if ((~uVar7 & 0x9fffffff) == 0) {
          iVar6 = p->nSimWords;
          if ((iVar11 * iVar6 < 0) || (p->vSims->nSize <= iVar11 * iVar6)) goto LAB_0073f68f;
          if (0 < iVar6) {
            pwVar3 = p->vSims->pArray;
            lVar10 = 0;
            do {
              wVar5 = Gia_ManRandomW(0);
              pwVar3[(ulong)(uint)(iVar6 * iVar11) + lVar10] = wVar5;
              lVar10 = lVar10 + 1;
            } while (lVar10 < p->nSimWords);
          }
        }
        else {
          if ((-1 < (int)uVar7) || ((int)uVar4 == 0x1fffffff)) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGen.c"
                          ,0x6c,"int Gia_ManSimulateWords(Gia_Man_t *, int)");
          }
          uVar1 = p->nSimWords;
          if ((int)(iVar11 * uVar1) < 0) {
LAB_0073f68f:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                          ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
          }
          iVar6 = p->vSims->nSize;
          if (iVar6 <= (int)(iVar11 * uVar1)) goto LAB_0073f68f;
          uVar8 = uVar7 & 0x1fffffff;
          iVar9 = (iVar11 - uVar8) * uVar1;
          if ((iVar9 < 0) || (iVar6 <= iVar9)) goto LAB_0073f68f;
          pwVar3 = p->vSims->pArray;
          if ((uVar7 >> 0x1d & 1) == 0) {
            if (0 < (int)uVar1) {
              uVar4 = 0;
              do {
                pwVar3[uVar1 * iVar11 + uVar4] = pwVar3[(iVar11 - uVar8) * uVar1 + uVar4];
                uVar4 = uVar4 + 1;
              } while (uVar1 != uVar4);
            }
          }
          else if (0 < (int)uVar1) {
            uVar4 = 0;
            do {
              pwVar3[uVar1 * iVar11 + uVar4] = ~pwVar3[(iVar11 - uVar8) * uVar1 + uVar4];
              uVar4 = uVar4 + 1;
            } while (uVar1 != uVar4);
          }
        }
      }
      else {
        Gia_ManObjSimAnd(p,iVar11);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < p->nObjs);
  }
  return 1;
}

Assistant:

int Gia_ManSimulateWords( Gia_Man_t * p, int nWords )
{
    Gia_Obj_t * pObj; int i;
    // allocate simulation info for one timeframe
    Vec_WrdFreeP( &p->vSims );
    p->vSims = Vec_WrdStart( Gia_ManObjNum(p) * nWords );
    p->nSimWords = nWords;
    // perform simulation
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            Gia_ManObjSimAnd( p, i );
        else if ( Gia_ObjIsCi(pObj) )
            Gia_ManObjSimPi( p, i );
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ManObjSimPo( p, i );
        else assert( 0 );
    }
    return 1;
}